

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

unique_ptr<pbrt::RandomWalkIntegrator,_std::default_delete<pbrt::RandomWalkIntegrator>_>
pbrt::RandomWalkIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  _Head_base<0UL,_pbrt::RandomWalkIntegrator_*,_false> _Var1;
  int maxDepth;
  RandomWalkIntegrator *this;
  string local_78;
  _Head_base<0UL,_pbrt::RandomWalkIntegrator_*,_false> local_58;
  FileLoc *local_50;
  PrimitiveHandle local_48;
  TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  local_40;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58._M_head_impl = (RandomWalkIntegrator *)parameters;
  local_50 = loc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"maxdepth","");
  maxDepth = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&local_78,5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  this = (RandomWalkIntegrator *)operator_new(0x70);
  local_38.bits =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  local_40.bits =
       (aggregate->
       super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
       ).bits;
  local_48.
  super_TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
  .bits = (TaggedPointer<pbrt::SimplePrimitive,_pbrt::GeometricPrimitive,_pbrt::TransformedPrimitive,_pbrt::AnimatedPrimitive,_pbrt::BVHAggregate,_pbrt::KdTreeAggregate>
           )(lights->super__Vector_base<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  std::vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_>::vector
            ((vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_78,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)local_50);
  RandomWalkIntegrator
            (this,maxDepth,(CameraHandle *)&local_38,(SamplerHandle *)&local_40,&local_48,
             (vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *)&local_78);
  _Var1._M_head_impl = local_58._M_head_impl;
  ((local_58._M_head_impl)->super_RayIntegrator).super_ImageTileIntegrator.super_Integrator.
  _vptr_Integrator = (_func_int **)this;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_78._M_dataplus._M_p,
                    local_78.field_2._M_allocated_capacity - (long)local_78._M_dataplus._M_p);
  }
  return (__uniq_ptr_data<pbrt::RandomWalkIntegrator,_std::default_delete<pbrt::RandomWalkIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::RandomWalkIntegrator,_std::default_delete<pbrt::RandomWalkIntegrator>,_true,_true>
            )_Var1._M_head_impl;
}

Assistant:

std::unique_ptr<RandomWalkIntegrator> RandomWalkIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    return std::make_unique<RandomWalkIntegrator>(maxDepth, camera, sampler, aggregate,
                                                  lights);
}